

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::compiler::Compiler::Node_*>::setCapacity
          (Vector<capnp::compiler::Compiler::Node_*> *this,size_t newSize)

{
  Node **ppNVar1;
  ArrayBuilder<capnp::compiler::Compiler::Node_*> newBuilder;
  ArrayBuilder<capnp::compiler::Compiler::Node_*> local_30;
  
  ppNVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppNVar1 >> 3)) {
    (this->builder).pos = ppNVar1 + newSize;
  }
  local_30.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::compiler::Compiler::Node*>
                           (newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<capnp::compiler::Compiler::Node*>::
  addAll<kj::ArrayBuilder<capnp::compiler::Compiler::Node*>>
            ((ArrayBuilder<capnp::compiler::Compiler::Node*> *)&local_30,&this->builder);
  ArrayBuilder<capnp::compiler::Compiler::Node_*>::operator=(&this->builder,&local_30);
  ArrayBuilder<capnp::compiler::Compiler::Node_*>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }